

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData
          (MessageGenerator *this,Printer *p)

{
  long *plVar1;
  Printer *pPVar2;
  NewOpRequirements NVar3;
  FileOptions_OptimizeMode FVar4;
  long *plVar5;
  char *pcVar6;
  anon_class_1_0_00000001_for_cb *value;
  anon_class_1_0_00000001_for_cb *value_00;
  _Alloc_hider _Var7;
  long lVar8;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  anon_class_16_2_fd512ddd_for_cb_conflict1 on_demand_register_arena_dtor;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  vars;
  anon_class_16_2_fd512ddd_for_cb_conflict1 custom_vtable_methods;
  anon_class_16_2_fd512ddd_for_cb_conflict1 is_initialized;
  anon_class_1_0_00000001 local_771;
  Printer *local_770;
  undefined1 *local_768;
  undefined8 local_760;
  undefined1 local_758;
  undefined7 uStack_757;
  undefined8 uStack_750;
  char *local_748;
  size_type local_740;
  char local_738;
  undefined7 uStack_737;
  undefined8 uStack_730;
  char *local_728;
  size_type local_720;
  char local_718;
  undefined7 uStack_717;
  undefined8 uStack_710;
  char *local_708;
  size_type local_700;
  char local_6f8;
  undefined7 uStack_6f7;
  undefined8 uStack_6f0;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  anon_class_16_2_fd512ddd_for_cb_conflict1 local_528;
  undefined1 auStack_518 [40];
  MessageGenerator *apMStack_4f0 [2];
  undefined1 local_4e0 [48];
  AlphaNum local_4b0;
  Sub local_480;
  undefined1 local_3c8 [56];
  code *local_390;
  __index_type local_388;
  _Alloc_hider local_380;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  bool local_360;
  bool local_318;
  undefined1 local_310 [56];
  code *local_2d8;
  __index_type local_2d0;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  bool local_2a8;
  bool local_260;
  Sub local_258;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_770 = p;
  NVar3 = GetNewOp(this,(Printer *)0x0);
  io::Printer::Emit(p,0,0,0xd6,
                    "\n    inline void* $nonnull$ $classname$::PlacementNew_(\n        //~\n        const void* $nonnull$, void* $nonnull$ mem,\n        $pb$::Arena* $nullable$ arena) {\n      return ::new (mem) $classname$(arena);\n    }\n  "
                   );
  if (((uint3)NVar3 >> 0x10 & 1) == 0) {
    if (((uint3)NVar3 >> 8 & 1) == 0) {
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"copy_type","");
      pcVar6 = "ZeroInit";
      if (((uint3)NVar3 & 1) != 0) {
        pcVar6 = "CopyInit";
      }
      io::Printer::Sub::Sub<char_const(&)[9]>(&local_480,&local_628,(char (*) [9])pcVar6);
      local_728 = &local_718;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"arena_offsets","");
      local_3c8._0_8_ = local_3c8 + 0x10;
      if (local_728 == &local_718) {
        local_3c8._24_8_ = uStack_710;
      }
      else {
        local_3c8._0_8_ = local_728;
      }
      local_3c8._8_8_ = local_720;
      local_720 = 0;
      local_718 = '\0';
      local_728 = &local_718;
      local_3c8._32_8_ = operator_new(0x18);
      *(MessageGenerator **)local_3c8._32_8_ = this;
      *(Printer ***)(local_3c8._32_8_ + 8) = &local_770;
      *(undefined1 *)(local_3c8._32_8_ + 0x10) = 0;
      local_390 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_3c8._40_8_ = 0;
      local_3c8._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_388 = '\x01';
      local_380._M_p = (pointer)&local_370;
      local_378 = 0;
      local_370._M_local_buf[0] = '\0';
      local_360 = false;
      std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x120d342);
      local_318 = false;
      pcVar6 = 
      "\n              constexpr auto $classname$::InternalNewImpl_() {\n                return $pbi$::MessageCreator::$copy_type$(sizeof($classname$),\n                                                          alignof($classname$));\n              }\n            "
      ;
      io::Printer::Emit(p,&local_480,2);
      lVar8 = 0x170;
      do {
        if (local_4b0.digits_[lVar8 + 0x18] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_4e0 + lVar8 + 0x18));
        }
        if ((long *)(local_4e0 + lVar8) != *(long **)((long)apMStack_4f0 + lVar8)) {
          operator_delete(*(long **)((long)apMStack_4f0 + lVar8),*(long *)(local_4e0 + lVar8) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)auStack_518[lVar8 + 0x20]]._M_data)
                  ((anon_class_1_0_00000001 *)&local_528,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(auStack_518 + lVar8));
        plVar5 = (long *)((long)&local_528.this + lVar8);
        auStack_518[lVar8 + 0x20] = 0xff;
        plVar1 = *(long **)((long)&local_548.field_2 + lVar8);
        if (plVar5 != plVar1) {
          operator_delete(plVar1,*plVar5 + 1);
        }
        lVar8 = lVar8 + -0xb8;
      } while (lVar8 != 0);
      if (local_728 != &local_718) {
        operator_delete(local_728,CONCAT71(uStack_717,local_718) + 1);
      }
      local_608.field_2._M_allocated_capacity = local_628.field_2._M_allocated_capacity;
      _Var7._M_p = local_628._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
LAB_00dad7ee:
        operator_delete(_Var7._M_p,local_608.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"copy_type","");
      pcVar6 = "ZeroInit";
      if (((uint3)NVar3 & 1) != 0) {
        pcVar6 = "CopyInit";
      }
      io::Printer::Sub::Sub<char_const(&)[9]>(&local_480,&local_608,(char (*) [9])pcVar6);
      local_708 = &local_6f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"arena_offsets","");
      local_3c8._0_8_ = local_3c8 + 0x10;
      if (local_708 == &local_6f8) {
        local_3c8._24_8_ = uStack_6f0;
      }
      else {
        local_3c8._0_8_ = local_708;
      }
      local_3c8._8_8_ = local_700;
      local_700 = 0;
      local_6f8 = '\0';
      local_708 = &local_6f8;
      local_3c8._32_8_ = operator_new(0x18);
      *(MessageGenerator **)local_3c8._32_8_ = this;
      *(Printer ***)(local_3c8._32_8_ + 8) = &local_770;
      *(undefined1 *)(local_3c8._32_8_ + 0x10) = 0;
      local_390 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_3c8._40_8_ = 0;
      local_3c8._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_388 = '\x01';
      local_380._M_p = (pointer)&local_370;
      local_378 = 0;
      local_370._M_local_buf[0] = '\0';
      local_360 = false;
      std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x120d342);
      local_318 = false;
      pcVar6 = 
      "\n              constexpr auto $classname$::InternalNewImpl_() {\n                constexpr auto arena_bits = $pbi$::EncodePlacementArenaOffsets({\n                    $arena_offsets$,\n                });\n                if (arena_bits.has_value()) {\n                  return $pbi$::MessageCreator::$copy_type$(\n                      sizeof($classname$), alignof($classname$), *arena_bits);\n                } else {\n                  return $pbi$::MessageCreator(&$classname$::PlacementNew_,\n                                               sizeof($classname$),\n                                               alignof($classname$));\n                }\n              }\n            "
      ;
      io::Printer::Emit(p,&local_480,2);
      lVar8 = 0x170;
      do {
        if (local_4b0.digits_[lVar8 + 0x18] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_4e0 + lVar8 + 0x18));
        }
        if ((long *)(local_4e0 + lVar8) != *(long **)((long)apMStack_4f0 + lVar8)) {
          operator_delete(*(long **)((long)apMStack_4f0 + lVar8),*(long *)(local_4e0 + lVar8) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)auStack_518[lVar8 + 0x20]]._M_data)
                  ((anon_class_1_0_00000001 *)&local_528,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(auStack_518 + lVar8));
        plVar5 = (long *)((long)&local_528.this + lVar8);
        auStack_518[lVar8 + 0x20] = 0xff;
        plVar1 = *(long **)((long)&local_548.field_2 + lVar8);
        if (plVar5 != plVar1) {
          operator_delete(plVar1,*plVar5 + 1);
        }
        lVar8 = lVar8 + -0xb8;
      } while (lVar8 != 0);
      if (local_708 != &local_6f8) {
        operator_delete(local_708,CONCAT71(uStack_6f7,local_6f8) + 1);
      }
      _Var7._M_p = local_608._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) goto LAB_00dad7ee;
    }
  }
  else {
    pcVar6 = 
    "\n      constexpr auto $classname$::InternalNewImpl_() {\n        return $pbi$::MessageCreator(&$classname$::PlacementNew_,\n                                     sizeof($classname$), alignof($classname$));\n      }\n    "
    ;
    io::Printer::Emit(p,0,0);
  }
  pPVar2 = local_770;
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"default_instance","");
  local_528.this = (MessageGenerator *)0x1;
  local_528.p = (Printer **)0x1428b91;
  DefaultInstanceName_abi_cxx11_
            (&local_5e8,(cpp *)this->descriptor_,(Descriptor *)&this->options_,(Options *)0x0,
             SUB81(pcVar6,0));
  local_4b0.piece_._M_len = local_5e8._M_string_length;
  local_4b0.piece_._M_str = local_5e8._M_dataplus._M_p;
  local_4e0._0_8_ = &DAT_0000000a;
  local_4e0._8_8_ = "._instance";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_5c8,(lts_20250127 *)&local_528,&local_4b0,(AlphaNum *)local_4e0,
             (AlphaNum *)pcVar6);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_480,&local_548,&local_5c8);
  vars_00.len_ = 1;
  vars_00.ptr_ = &local_480;
  io::Printer::WithDefs
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)(auStack_518 + 0x20),pPVar2,vars_00,false);
  if (local_480.annotation_.
      super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload
      .super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
      true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               &local_480.annotation_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480.value_.consume_after._M_dataplus._M_p != &local_480.value_.consume_after.field_2)
  {
    operator_delete(local_480.value_.consume_after._M_dataplus._M_p,
                    local_480.value_.consume_after.field_2._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr
    [local_480.value_.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     _M_index]._M_data)(&local_771,&local_480.value_.value);
  local_480.value_.value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index =
       0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480.key_._M_dataplus._M_p != &local_480.key_.field_2) {
    operator_delete(local_480.key_._M_dataplus._M_p,local_480.key_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  local_528.this = this;
  local_528.p = &local_770;
  local_4e0._0_8_ = this;
  local_4e0._8_8_ = &local_770;
  local_4b0.piece_._M_len = (size_t)this;
  local_4b0.piece_._M_str = (char *)&local_770;
  FVar4 = GetOptimizeFor(this->descriptor_->file_,&this->options_,(bool *)0x0);
  pPVar2 = local_770;
  if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"type_size","");
    local_5c8._M_dataplus._M_p =
         (pointer)((ulong)*(ushort *)((this->descriptor_->all_names_).payload_ + 2) + 1);
    io::Printer::Sub::Sub<unsigned_long>(&local_480,&local_6c8,(unsigned_long *)&local_5c8);
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_568,"on_demand_register_arena_dtor","");
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__2_const&>
              ((Sub *)local_3c8,&local_568,&local_528);
    local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"is_initialized","");
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__3_const&>
              ((Sub *)local_310,&local_6e8,(anon_class_16_2_fd512ddd_for_cb_conflict1 *)&local_4b0);
    local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"custom_vtable_methods","")
    ;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__4_const&>
              (&local_258,&local_588,(anon_class_16_2_fd512ddd_for_cb_conflict1 *)local_4e0);
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"v2_data","");
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__5_const&>
              (&local_1a0,&local_5a8,value);
    io::Printer::Emit(pPVar2,&local_480,5,0x676,
                      "\n          constexpr auto $classname$::InternalGenerateClassData_() {\n            return $pbi$::ClassDataLite<$type_size$>{\n                {\n                    $default_instance$,\n                    &_table_.header,\n                    $on_demand_register_arena_dtor$,\n                    $is_initialized$,\n                    &$classname$::MergeImpl,\n                    $superclass$::GetNewImpl<$classname$>(),\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n                    &$classname$::SharedDtor,\n                    $custom_vtable_methods$,\n#endif  // PROTOBUF_CUSTOM_VTABLE\n                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),\n                    true,\n                    $v2_data$,\n                },\n                \"$full_name$\",\n            };\n          }\n\n          PROTOBUF_CONSTINIT\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          const $pbi$::ClassDataLite<$type_size$> $classname$_class_data_ =\n              $classname$::InternalGenerateClassData_();\n\n          //~ This function needs to be marked as weak to avoid significantly\n          //~ slowing down compilation times.  This breaks up LLVM\'s SCC\n          //~ in the .pb.cc translation units. Large translation units see a\n          //~ reduction of roughly 50% of walltime for optimized builds.\n          //~ Without the weak attribute all the messages in the file, including\n          //~ all the vtables and everything they use become part of the same\n          //~ SCC.\n          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$\n          $classname$::GetClassData() const {\n            return $classname$_class_data_.base();\n          }\n        "
                     );
    lVar8 = 0x398;
    do {
      if (local_4b0.digits_[lVar8 + 0x18] == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_4e0 + lVar8 + 0x18));
      }
      if ((long *)(local_4e0 + lVar8) != *(long **)((long)apMStack_4f0 + lVar8)) {
        operator_delete(*(long **)((long)apMStack_4f0 + lVar8),*(long *)(local_4e0 + lVar8) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)auStack_518[lVar8 + 0x20]]._M_data)
                ((anon_class_1_0_00000001 *)&local_5e8,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(auStack_518 + lVar8));
      plVar5 = (long *)((long)&local_528.this + lVar8);
      auStack_518[lVar8 + 0x20] = 0xff;
      plVar1 = *(long **)((long)&local_548.field_2 + lVar8);
      if (plVar5 != plVar1) {
        operator_delete(plVar1,*plVar5 + 1);
      }
      lVar8 = lVar8 + -0xb8;
    } while (lVar8 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
      operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
    local_648.field_2._M_allocated_capacity = local_6c8.field_2._M_allocated_capacity;
    _Var7._M_p = local_6c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p == &local_6c8.field_2) goto LAB_00dae165;
  }
  else {
    local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_648,"on_demand_register_arena_dtor","");
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__2_const&>
              (&local_480,&local_648,&local_528);
    local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"is_initialized","");
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__3_const&>
              ((Sub *)local_3c8,&local_668,(anon_class_16_2_fd512ddd_for_cb_conflict1 *)&local_4b0);
    local_748 = &local_738;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"pin_weak_descriptor","");
    local_310._0_8_ = local_310 + 0x10;
    if (local_748 == &local_738) {
      local_310._24_8_ = uStack_730;
    }
    else {
      local_310._0_8_ = local_748;
    }
    local_310._8_8_ = local_740;
    local_740 = 0;
    local_738 = '\0';
    local_748 = &local_738;
    local_310._32_8_ = operator_new(0x18);
    *(MessageGenerator **)local_310._32_8_ = this;
    *(Printer ***)(local_310._32_8_ + 8) = &local_770;
    *(undefined1 *)(local_310._32_8_ + 0x10) = 0;
    local_2d8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_310._40_8_ = 0;
    local_310._48_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_2d0 = '\x01';
    local_2c8._M_p = (pointer)&local_2b8;
    local_2c0 = 0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = false;
    std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x120d342);
    local_260 = false;
    local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"custom_vtable_methods","")
    ;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__4_const&>
              (&local_258,&local_688,(anon_class_16_2_fd512ddd_for_cb_conflict1 *)local_4e0);
    local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"v2_data","");
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__5_const&>
              (&local_1a0,&local_6a8,value_00);
    local_768 = &local_758;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_768,"tracker_on_get_metadata","");
    local_e8 = local_d8;
    if (local_768 == &local_758) {
      uStack_d0 = uStack_750;
    }
    else {
      local_e8 = local_768;
    }
    local_e0 = local_760;
    local_760 = 0;
    local_758 = 0;
    local_768 = &local_758;
    local_c8 = (undefined8 *)operator_new(0x18);
    *local_c8 = this;
    local_c8[1] = &local_770;
    *(undefined1 *)(local_c8 + 2) = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_c0 = 0;
    local_b8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_a8 = 1;
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x120d342);
    local_38 = 0;
    io::Printer::Emit(pPVar2,&local_480,6,0x779,
                      "\n          constexpr auto $classname$::InternalGenerateClassData_() {\n            return $pbi$::ClassDataFull{\n                $pbi$::ClassData{\n                    $default_instance$,\n                    &_table_.header,\n                    $on_demand_register_arena_dtor$,\n                    $is_initialized$,\n                    &$classname$::MergeImpl,\n                    $superclass$::GetNewImpl<$classname$>(),\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n                    &$classname$::SharedDtor,\n                    $custom_vtable_methods$,\n#endif  // PROTOBUF_CUSTOM_VTABLE\n                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),\n                    false,\n                    $v2_data$,\n                },\n                &$classname$::kDescriptorMethods,\n                &$desc_table$,\n                $tracker_on_get_metadata$,\n            };\n          }\n\n          PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1 const\n              $pbi$::ClassDataFull $classname$_class_data_ =\n                  $classname$::InternalGenerateClassData_();\n\n          //~ This function needs to be marked as weak to avoid significantly\n          //~ slowing down compilation times.  This breaks up LLVM\'s SCC\n          //~ in the .pb.cc translation units. Large translation units see a\n          //~ reduction of roughly 50% of walltime for optimized builds.\n          //~ Without the weak attribute all the messages in the file, including\n          //~ all the vtables and everything they use become part of the same\n          //~ SCC.\n          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$\n          $classname$::GetClassData() const {\n            $pin_weak_descriptor$;\n            $pbi$::PrefetchToLocalCache(&$classname$_class_data_);\n            $pbi$::PrefetchToLocalCache($classname$_class_data_.tc_table);\n            return $classname$_class_data_.base();\n          }\n        "
                     );
    lVar8 = 0x450;
    do {
      if (local_4b0.digits_[lVar8 + 0x18] == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_4e0 + lVar8 + 0x18));
      }
      if ((long *)(local_4e0 + lVar8) != *(long **)((long)apMStack_4f0 + lVar8)) {
        operator_delete(*(long **)((long)apMStack_4f0 + lVar8),*(long *)(local_4e0 + lVar8) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[(byte)auStack_518[lVar8 + 0x20]]._M_data)
                ((anon_class_1_0_00000001 *)&local_5c8,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(auStack_518 + lVar8));
      plVar5 = (long *)((long)&local_528.this + lVar8);
      auStack_518[lVar8 + 0x20] = 0xff;
      plVar1 = *(long **)((long)&local_548.field_2 + lVar8);
      if (plVar5 != plVar1) {
        operator_delete(plVar1,*plVar5 + 1);
      }
      lVar8 = lVar8 + -0xb8;
    } while (lVar8 != 0);
    if (local_768 != &local_758) {
      operator_delete(local_768,CONCAT71(uStack_757,local_758) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
      operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_688._M_dataplus._M_p != &local_688.field_2) {
      operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
    }
    if (local_748 != &local_738) {
      operator_delete(local_748,CONCAT71(uStack_737,local_738) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_668._M_dataplus._M_p != &local_668.field_2) {
      operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
    }
    _Var7._M_p = local_648._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p == &local_648.field_2) goto LAB_00dae165;
  }
  operator_delete(_Var7._M_p,local_648.field_2._M_allocated_capacity + 1);
LAB_00dae165:
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)(auStack_518 + 0x20));
  return;
}

Assistant:

void MessageGenerator::GenerateClassData(io::Printer* p) {
  const auto new_op = GetNewOp(nullptr);
  // Always generate PlacementNew_ because we might need it for different
  // reasons. EnableCustomNewFor<T> might be false in this compiler, or the
  // object might be too large for arena seeding.
  // We mark `inline` to avoid library bloat if the function is unused.
  p->Emit(R"cc(
    inline void* $nonnull$ $classname$::PlacementNew_(
        //~
        const void* $nonnull$, void* $nonnull$ mem,
        $pb$::Arena* $nullable$ arena) {
      return ::new (mem) $classname$(arena);
    }
  )cc");
  if (new_op.needs_to_run_constructor) {
    p->Emit(R"cc(
      constexpr auto $classname$::InternalNewImpl_() {
        return $pbi$::MessageCreator(&$classname$::PlacementNew_,
                                     sizeof($classname$), alignof($classname$));
      }
    )cc");
  } else if (new_op.needs_arena_seeding) {
    p->Emit({{"copy_type", new_op.needs_memcpy ? "CopyInit" : "ZeroInit"},
             {"arena_offsets", [&] { GetNewOp(p); }}},
            R"cc(
              constexpr auto $classname$::InternalNewImpl_() {
                constexpr auto arena_bits = $pbi$::EncodePlacementArenaOffsets({
                    $arena_offsets$,
                });
                if (arena_bits.has_value()) {
                  return $pbi$::MessageCreator::$copy_type$(
                      sizeof($classname$), alignof($classname$), *arena_bits);
                } else {
                  return $pbi$::MessageCreator(&$classname$::PlacementNew_,
                                               sizeof($classname$),
                                               alignof($classname$));
                }
              }
            )cc");
  } else {
    p->Emit({{"copy_type", new_op.needs_memcpy ? "CopyInit" : "ZeroInit"},
             {"arena_offsets", [&] { GetNewOp(p); }}},
            R"cc(
              constexpr auto $classname$::InternalNewImpl_() {
                return $pbi$::MessageCreator::$copy_type$(sizeof($classname$),
                                                          alignof($classname$));
              }
            )cc");
  }

  auto vars = p->WithVars(
      {{"default_instance",
        absl::StrCat("&", DefaultInstanceName(descriptor_, options_),
                     "._instance")}});
  const auto on_demand_register_arena_dtor = [&] {
    if (NeedsArenaDestructor() == ArenaDtorNeeds::kOnDemand) {
      p->Emit(R"cc(
        $classname$::OnDemandRegisterArenaDtor,
      )cc");
    } else {
      p->Emit(R"cc(
        nullptr,  // OnDemandRegisterArenaDtor
      )cc");
    }
  };
  const auto is_initialized = [&] {
    if (NeedsIsInitialized()) {
      p->Emit(R"cc(
        $classname$::IsInitializedImpl,
      )cc");
    } else {
      p->Emit(R"cc(
        nullptr,  // IsInitialized
      )cc");
    }
  };
  const auto custom_vtable_methods = [&] {
    if (HasGeneratedMethods(descriptor_->file(), options_) &&
        !IsMapEntryMessage(descriptor_)) {
      p->Emit(R"cc(
        $superclass$::GetClearImpl<$classname$>(), &$classname$::ByteSizeLong,
            &$classname$::_InternalSerialize,
      )cc");
    } else {
      p->Emit(R"cc(
        static_cast<void ($pb$::MessageLite::*)()>(&$classname$::ClearImpl),
            $superclass$::ByteSizeLongImpl, $superclass$::_InternalSerializeImpl
            ,
      )cc");
    }
  };

  const auto emit_v2_data = [&] {
  };

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    const auto pin_weak_descriptor = [&] {
      if (!UsingImplicitWeakDescriptor(descriptor_->file(), options_)) return;

      p->Emit({{"pin", StrongReferenceToType(descriptor_, options_)}},
              R"cc(
                $pin$;
              )cc");

      // For CODE_SIZE types, we need to pin the submessages too.
      // SPEED types will pin them via the TcParse table automatically.
      if (HasGeneratedMethods(descriptor_->file(), options_)) return;
      for (int i = 0; i < descriptor_->field_count(); ++i) {
        auto* field = descriptor_->field(i);
        if (field->type() != field->TYPE_MESSAGE) continue;
        p->Emit(
            {{"pin", StrongReferenceToType(field->message_type(), options_)}},
            R"cc(
              $pin$;
            )cc");
      }
    };
    p->Emit(
        {
            {"on_demand_register_arena_dtor", on_demand_register_arena_dtor},
            {"is_initialized", is_initialized},
            {"pin_weak_descriptor", pin_weak_descriptor},
            {"custom_vtable_methods", custom_vtable_methods},
            {"v2_data", emit_v2_data},
            {"tracker_on_get_metadata",
             [&] {
               if (HasTracker(descriptor_, options_)) {
                 p->Emit(R"cc(
                   &Impl_::TrackerOnGetMetadata,
                 )cc");
               } else {
                 p->Emit(R"cc(
                   nullptr,  // tracker
                 )cc");
               }
             }},
        },
        R"cc(
          constexpr auto $classname$::InternalGenerateClassData_() {
            return $pbi$::ClassDataFull{
                $pbi$::ClassData{
                    $default_instance$,
                    &_table_.header,
                    $on_demand_register_arena_dtor$,
                    $is_initialized$,
                    &$classname$::MergeImpl,
                    $superclass$::GetNewImpl<$classname$>(),
#if defined(PROTOBUF_CUSTOM_VTABLE)
                    &$classname$::SharedDtor,
                    $custom_vtable_methods$,
#endif  // PROTOBUF_CUSTOM_VTABLE
                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),
                    false,
                    $v2_data$,
                },
                &$classname$::kDescriptorMethods,
                &$desc_table$,
                $tracker_on_get_metadata$,
            };
          }

          PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1 const
              $pbi$::ClassDataFull $classname$_class_data_ =
                  $classname$::InternalGenerateClassData_();

          //~ This function needs to be marked as weak to avoid significantly
          //~ slowing down compilation times.  This breaks up LLVM's SCC
          //~ in the .pb.cc translation units. Large translation units see a
          //~ reduction of roughly 50% of walltime for optimized builds.
          //~ Without the weak attribute all the messages in the file, including
          //~ all the vtables and everything they use become part of the same
          //~ SCC.
          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$
          $classname$::GetClassData() const {
            $pin_weak_descriptor$;
            $pbi$::PrefetchToLocalCache(&$classname$_class_data_);
            $pbi$::PrefetchToLocalCache($classname$_class_data_.tc_table);
            return $classname$_class_data_.base();
          }
        )cc");
  } else {
    p->Emit(
        {
            {"type_size", descriptor_->full_name().size() + 1},
            {"on_demand_register_arena_dtor", on_demand_register_arena_dtor},
            {"is_initialized", is_initialized},
            {"custom_vtable_methods", custom_vtable_methods},
            {"v2_data", emit_v2_data},
        },
        R"cc(
          constexpr auto $classname$::InternalGenerateClassData_() {
            return $pbi$::ClassDataLite<$type_size$>{
                {
                    $default_instance$,
                    &_table_.header,
                    $on_demand_register_arena_dtor$,
                    $is_initialized$,
                    &$classname$::MergeImpl,
                    $superclass$::GetNewImpl<$classname$>(),
#if defined(PROTOBUF_CUSTOM_VTABLE)
                    &$classname$::SharedDtor,
                    $custom_vtable_methods$,
#endif  // PROTOBUF_CUSTOM_VTABLE
                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),
                    true,
                    $v2_data$,
                },
                "$full_name$",
            };
          }

          PROTOBUF_CONSTINIT
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          const $pbi$::ClassDataLite<$type_size$> $classname$_class_data_ =
              $classname$::InternalGenerateClassData_();

          //~ This function needs to be marked as weak to avoid significantly
          //~ slowing down compilation times.  This breaks up LLVM's SCC
          //~ in the .pb.cc translation units. Large translation units see a
          //~ reduction of roughly 50% of walltime for optimized builds.
          //~ Without the weak attribute all the messages in the file, including
          //~ all the vtables and everything they use become part of the same
          //~ SCC.
          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$
          $classname$::GetClassData() const {
            return $classname$_class_data_.base();
          }
        )cc");
  }
}